

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

double bsc_costs_std_root_p_tree_put(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  double dVar1;
  double dVar2;
  int local_3c;
  double local_38;
  double one_phase;
  bsc_pid_t root_P;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t i;
  bsc_size_t n_local;
  bsc_coll_params_t *set_local;
  bsc_group_t group_local;
  
  if (group == (bsc_group_t)0x0) {
    local_3c = bsp_nprocs();
  }
  else {
    local_3c = *group;
  }
  dVar1 = sqrt((double)local_3c);
  dVar1 = ceil(dVar1);
  local_38 = bsc_L(BSC_PUT);
  for (g._0_4_ = 0; (int)g < n; g._0_4_ = (int)g + 1) {
    dVar2 = bsc_g(BSC_PUT,set[(int)g].size);
    local_38 = (double)((int)dVar1 + -1) * dVar2 * (double)set[(int)g].size + local_38;
  }
  return local_38 * 2.0;
}

Assistant:

double bsc_costs_std_root_p_tree_put(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_pid_t root_P = (bsc_pid_t) ceil(sqrt(P));
    double one_phase = bsc_L(BSC_PUT); 
    for ( i = 0; i < n ; ++i )
        one_phase += (root_P - 1) * bsc_g(BSC_PUT, set[i].size) * set[i].size;

    return 2*one_phase;
}